

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O3

bool __thiscall
DyndepLoader::LoadDyndepFile(DyndepLoader *this,Node *file,DyndepFile *ddf,string *err)

{
  bool bVar1;
  DyndepParser parser;
  DyndepParser local_d8;
  
  DyndepParser::DyndepParser(&local_d8,this->state_,(FileReader *)this->disk_interface_,ddf);
  bVar1 = Parser::Load(&local_d8.super_Parser,&file->path_,err,(Lexer *)0x0);
  local_d8.super_Parser._vptr_Parser = (_func_int **)&PTR_Parse_0012ec28;
  local_d8.env_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_0012ecf0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_d8.env_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_d8.env_.bindings_._M_t);
  return bVar1;
}

Assistant:

bool DyndepLoader::LoadDyndepFile(Node* file, DyndepFile* ddf,
                                  std::string* err) const {
  DyndepParser parser(state_, disk_interface_, ddf);
  return parser.Load(file->path(), err);
}